

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O2

Ref<embree::XML> __thiscall
embree::parseXML(embree *this,FileName *fileName,string *id,bool hasHeader)

{
  FileStream *this_00;
  Ref<embree::Stream<int>_> local_50;
  string local_48;
  
  this_00 = (FileStream *)::operator_new(0x270);
  FileStream::FileStream(this_00,fileName);
  local_50.ptr = (Stream<int> *)this_00;
  (*(this_00->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this_00);
  std::__cxx11::string::string((string *)&local_48,(string *)id);
  parseXML(this,&local_50,&local_48,hasHeader,false);
  std::__cxx11::string::~string((string *)&local_48);
  if ((FileStream *)local_50.ptr != (FileStream *)0x0) {
    (*(((Stream<int> *)&(local_50.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  return (Ref<embree::XML>)(XML *)this;
}

Assistant:

Ref<XML> parseXML(const FileName& fileName, std::string id, bool hasHeader) {
    return parseXML(new FileStream(fileName),id,hasHeader,false);
  }